

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastZ64S2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ParseContext *pPVar1;
  byte *pbVar2;
  MessageLite *pMVar3;
  uint64_t uVar4;
  TcParseTableBase *this;
  byte bVar5;
  bool bVar6;
  unsigned_short uVar7;
  uint16_t uVar8;
  uint uVar9;
  char *pcVar10;
  int64_t iVar11;
  long *plVar12;
  uint *puVar13;
  ulong uVar14;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_130;
  uint64_t local_128;
  TcParseTableBase *local_120;
  ParseContext *local_118;
  byte *local_110;
  MessageLite *local_108;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_100;
  TcFieldData local_f8;
  TcFieldData local_f0;
  undefined1 local_e1;
  ulong uStack_e0;
  bool always_return;
  TcParseTableBase *local_d8;
  ParseContext *local_d0;
  byte *local_c8;
  MessageLite *local_c0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_a8;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  
  local_128 = hasbits;
  local_120 = table;
  local_118 = ctx;
  local_110 = (byte *)ptr;
  local_108 = msg;
  local_100 = data.field_0;
  uVar7 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)&local_100);
  pMVar3 = local_108;
  pbVar2 = local_110;
  pPVar1 = local_118;
  if (uVar7 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&local_130);
    pcVar10 = MiniParse(pMVar3,(char *)pbVar2,pPVar1,(TcFieldData)local_130,local_120,local_128);
    return pcVar10;
  }
  local_110 = local_110 + 2;
  bVar5 = TcFieldData::hasbit_idx((TcFieldData *)&local_100);
  local_128 = 1L << (bVar5 & 0x3f) | local_128;
  if ((char)*local_110 < '\0') {
    pcVar10 = SingularVarBigint<long,unsigned_short,true>
                        (local_108,(char *)local_110,local_118,(TcFieldData)local_100,local_120,
                         local_128);
    return pcVar10;
  }
  bVar5 = *local_110;
  local_110 = local_110 + 1;
  iVar11 = (anonymous_namespace)::ZigZagDecodeHelper<long,true>((ulong)bVar5);
  pMVar3 = local_108;
  uVar8 = TcFieldData::offset((TcFieldData *)&local_100);
  plVar12 = RefAt<long>(pMVar3,(ulong)uVar8);
  pMVar3 = local_108;
  pbVar2 = local_110;
  pPVar1 = local_118;
  *plVar12 = iVar11;
  TcFieldData::TcFieldData(&data_local);
  local_b8 = data_local.field_0;
  local_c0 = pMVar3;
  local_c8 = pbVar2;
  local_d0 = pPVar1;
  local_d8 = local_120;
  uStack_e0 = local_128;
  local_e1 = 0;
  bVar6 = EpsCopyInputStream::DataAvailable(&pPVar1->super_EpsCopyInputStream,(char *)pbVar2);
  pMVar3 = local_c0;
  pbVar2 = local_c8;
  pPVar1 = local_d0;
  if (!bVar6) {
    TcFieldData::TcFieldData(&local_f0);
    if (local_d8->has_bits_offset != 0) {
      uVar9 = (uint)uStack_e0;
      puVar13 = RefAt<unsigned_int>(pMVar3,(ulong)(uint)local_d8->has_bits_offset);
      *puVar13 = uVar9 | *puVar13;
    }
    return (char *)pbVar2;
  }
  TcFieldData::TcFieldData(&local_f8);
  this = local_d8;
  uVar4 = uStack_e0;
  uVar7 = UnalignedLoad<unsigned_short>((char *)pbVar2);
  uVar14 = (ulong)(int)((uint)uVar7 & (uint)this->fast_idx_mask);
  if ((uVar14 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  data_1.field_0 =
       (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(this,uVar14 >> 3);
  local_a8.data =
       ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
       (ulong)uVar7;
  UNRECOVERED_JUMPTABLE = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0)
  ;
  local_b0.data = local_a8.data;
  pcVar10 = (*UNRECOVERED_JUMPTABLE)(pMVar3,(char *)pbVar2,pPVar1,(TcFieldData)local_a8,this,uVar4);
  return pcVar10;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastZ64S2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularVarint<int64_t, uint16_t, true>(
      PROTOBUF_TC_PARAM_PASS);
}